

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

int __thiscall
Fl_Menu_Item::insert
          (Fl_Menu_Item *this,int index,char *mytext,int sc,Fl_Callback *cb,void *data,int myflags)

{
  int size;
  int iVar1;
  char *pcVar2;
  Fl_Menu_Item *array;
  char cVar3;
  char *pcVar4;
  char *text;
  uint uVar5;
  Fl_Menu_Item *local_468;
  char buf [1024];
  
  size = local_array_size;
  if (local_array != this) {
    size = Fl_Menu_Item::size(this);
  }
  text = buf;
  local_468 = this;
LAB_001880c5:
  pcVar2 = text;
  if (*mytext == '_') {
    mytext = mytext + 1;
    uVar5 = 0x80;
  }
  else {
    if (*mytext == '/') {
      uVar5 = 0;
      text = mytext;
      goto LAB_001881de;
    }
    uVar5 = 0;
  }
  do {
    cVar3 = *mytext;
    if (cVar3 == '\\') {
      pcVar4 = mytext + 1;
      cVar3 = mytext[1];
      if (cVar3 == '\0') {
        cVar3 = '\\';
        pcVar4 = mytext;
      }
    }
    else if ((cVar3 == '\0') || (pcVar4 = mytext, cVar3 == '/')) break;
    mytext = pcVar4 + 1;
    *pcVar2 = cVar3;
    pcVar2 = pcVar2 + 1;
  } while( true );
  *pcVar2 = '\0';
  if (*mytext != '/') goto LAB_001881de;
  mytext = mytext + 1;
  for (; this->text != (char *)0x0; this = next(this,1)) {
    if (((this->flags & 0x40) != 0) && (iVar1 = compare(text,this->text), iVar1 == 0))
    goto LAB_001881b3;
  }
  iVar1 = (int)(((long)this - (long)local_468) / 0x38);
  array = array_insert(local_468,size,iVar1,text,uVar5 | 0x40);
  local_468 = array_insert(array,size + 1,iVar1 + 1,(char *)0x0,0);
  size = size + 2;
  this = local_468 + iVar1;
LAB_001881b3:
  this = this + 1;
  index = -1;
  goto LAB_001880c5;
LAB_001881de:
  if (this->text == (char *)0x0) {
    if (index == -1) {
      index = (int)(((long)this - (long)local_468) / 0x38);
    }
    local_468 = array_insert(local_468,size,index,text,uVar5 | myflags);
    iVar1 = size + 1;
    if ((myflags & 0x40U) != 0) {
      local_468 = array_insert(local_468,iVar1,index + 1,(char *)0x0,0);
      iVar1 = size + 2;
    }
    this = local_468 + index;
    size = iVar1;
LAB_001882a6:
    this->shortcut_ = sc;
    this->callback_ = cb;
    this->user_data_ = data;
    this->flags = uVar5 | myflags;
    if (local_468 == local_array) {
      local_array_size = size;
    }
    return (int)(((long)this - (long)local_468) / 0x38);
  }
  if (((this->flags & 0x40) == 0) && (iVar1 = compare(this->text,text), iVar1 == 0))
  goto LAB_001882a6;
  this = next(this,1);
  goto LAB_001881de;
}

Assistant:

int Fl_Menu_Item::insert(
  int index,
  const char *mytext,
  int sc,
  Fl_Callback *cb,	
  void *data,
  int myflags
) {
  Fl_Menu_Item *array = this;
  Fl_Menu_Item *m = this;
  const char *p;
  char *q;
  char buf[1024];

  int msize = array==local_array ? local_array_size : array->size();
  int flags1 = 0;
  const char* item;

  // split at slashes to make submenus:
  for (;;) {

    // leading slash makes us assume it is a filename:
    if (*mytext == '/') {item = mytext; break;}

    // leading underscore causes divider line:
    if (*mytext == '_') {mytext++; flags1 = FL_MENU_DIVIDER;}

    // copy to buf, changing \x to x:
    q = buf;
    for (p=mytext; *p && *p != '/'; *q++ = *p++) if (*p=='\\' && p[1]) p++;
    *q = 0;

    item = buf;
    if (*p != '/') break; /* not a menu title */
    index = -1;           /* any submenu specified overrides insert position */
    mytext = p+1;         /* point at item title */

    /* find a matching menu title: */
    for (; m->text; m = m->next())
      if (m->flags&FL_SUBMENU && !compare(item, m->text)) break;

    if (!m->text) { /* create a new menu */
      int n = (index==-1) ? (int) (m-array) : index;
      array = array_insert(array, msize, n, item, FL_SUBMENU|flags1);
      msize++;
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
      m = array+n;
    }
    m++;	/* go into the submenu */
    flags1 = 0;
  }

  /* find a matching menu item: */
  for (; m->text; m = m->next())
    if (!(m->flags&FL_SUBMENU) && !compare(m->text,item)) break;

  if (!m->text) {	/* add a new menu item */
    int n = (index==-1) ? (int) (m-array) : index;
    array = array_insert(array, msize, n, item, myflags|flags1);
    msize++;
    if (myflags & FL_SUBMENU) { // add submenu delimiter
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
    }
    m = array+n;
  }

  /* fill it in */
  m->shortcut_ = sc;
  m->callback_ = cb;
  m->user_data_ = data;
  m->flags = myflags|flags1;

  if (array == local_array) local_array_size = msize;
  return (int) (m-array);
}